

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O3

void __thiscall chrono::ChTimestepperNewmark::ArchiveIN(ChTimestepperNewmark *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChTimestepperNewmark *)&this[-1].Xnew,in_RSI);
  return;
}

Assistant:

void ChTimestepperNewmark::ArchiveIN(ChArchiveIn& archive) {
    // version number
    /*int version =*/ archive.VersionRead<ChTimestepperNewmark>();
    // deserialize parent class:
    ChTimestepperIIorder::ArchiveIN(archive);
    ChImplicitIterativeTimestepper::ArchiveIN(archive);
    // stream in all member data:
    archive >> CHNVP(beta);
    archive >> CHNVP(gamma);
}